

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  xpath_lexer_string *this;
  binary_op_t bVar4;
  ulong uStack_20;
  
  uVar2 = 0x400000000;
  iVar3 = 3;
  switch(lexer->_cur_lexeme) {
  case lex_equal:
    uStack_20 = 3;
    break;
  case lex_not_equal:
    uStack_20 = 4;
    break;
  case lex_less:
    uStack_20 = 5;
    goto LAB_0011df64;
  case lex_greater:
    uStack_20 = 6;
    goto LAB_0011df64;
  case lex_less_or_equal:
    uStack_20 = 7;
    goto LAB_0011df64;
  case lex_greater_or_equal:
    uStack_20 = 8;
LAB_0011df64:
    iVar3 = 4;
    break;
  case lex_plus:
    uStack_20 = 9;
    goto LAB_0011df7c;
  case lex_minus:
    uStack_20 = 10;
LAB_0011df7c:
    iVar3 = 5;
LAB_0011df97:
    uVar2 = 0x200000000;
    break;
  case lex_multiply:
    uStack_20 = 0xb;
    iVar3 = 6;
    goto LAB_0011df97;
  case lex_union:
    uStack_20 = 0xf;
    uVar2 = 0x100000000;
    iVar3 = 7;
    break;
  default:
    goto switchD_0011df2f_caseD_b;
  case lex_string:
    this = &lexer->_cur_lexeme_contents;
    bVar1 = xpath_lexer_string::operator==(this,"or");
    if (bVar1) {
      uStack_20 = 1;
      iVar3 = 1;
      break;
    }
    bVar1 = xpath_lexer_string::operator==(this,"and");
    if (bVar1) {
      uStack_20 = 2;
      iVar3 = 2;
      break;
    }
    uVar2 = 0x200000000;
    bVar1 = xpath_lexer_string::operator==(this,"div");
    iVar3 = 6;
    if (bVar1) {
      uStack_20 = 0xc;
      break;
    }
    bVar1 = xpath_lexer_string::operator==(this,"mod");
    if (bVar1) {
      uStack_20 = 0xd;
      break;
    }
    goto switchD_0011df2f_caseD_b;
  }
LAB_0011e005:
  bVar4.precedence = iVar3;
  bVar4.asttype = (int)(uVar2 | uStack_20);
  bVar4.rettype = (int)((uVar2 | uStack_20) >> 0x20);
  return bVar4;
switchD_0011df2f_caseD_b:
  iVar3 = 0;
  uVar2 = 0;
  uStack_20 = 0;
  goto LAB_0011e005;
}

Assistant:

lexeme_t current() const
		{
			return _cur_lexeme;
		}